

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O1

bool __thiscall directed_graph_t::add_edge(directed_graph_t *this,vertex_index_t v,vertex_index_t w)

{
  pointer puVar1;
  ulong *puVar2;
  iterator iVar3;
  ushort uVar4;
  vertex_index_t vVar5;
  vertex_index_t vVar6;
  logic_error *this_00;
  long *plVar7;
  ushort uVar8;
  size_type *psVar9;
  long *plVar10;
  bool bVar11;
  unsigned_short local_f4;
  ushort local_f2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  vVar5 = v;
  vVar6 = w;
  do {
    local_f4 = vVar6;
    local_f2 = vVar5;
    if (local_f2 <= local_f4) break;
    vVar5 = local_f4;
    vVar6 = local_f2;
  } while (this->directed == false);
  if ((local_f2 < this->number_of_vertices) && (local_f4 < this->number_of_vertices)) {
    uVar8 = local_f4 >> 6;
    bVar11 = ((this->incidence_outgoing).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [this->incidence_row_length * (ulong)local_f2 + (ulong)uVar8] &
             1L << ((byte)local_f4 & 0x3f)) == 0;
    if (bVar11) {
      uVar4 = local_f2 >> 6;
      puVar1 = (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + local_f2;
      *puVar1 = *puVar1 + 1;
      puVar1 = (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + local_f4;
      *puVar1 = *puVar1 + 1;
      iVar3._M_current =
           (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->edges,iVar3,
                   &local_f2);
      }
      else {
        *iVar3._M_current = local_f2;
        (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      iVar3._M_current =
           (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->edges,iVar3,
                   &local_f4);
      }
      else {
        *iVar3._M_current = local_f4;
        (this->edges).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      puVar2 = (this->incidence_outgoing).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               this->incidence_row_length * (ulong)local_f2 + (ulong)uVar8;
      *puVar2 = *puVar2 | 1L << ((byte)local_f4 & 0x3f);
      puVar2 = (this->incidence_incoming).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               this->incidence_row_length * (ulong)local_f4 + (ulong)uVar4;
      *puVar2 = *puVar2 | 1L << ((byte)local_f2 & 0x3f);
      bVar11 = true;
    }
    return bVar11;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  uVar8 = local_f4;
  if (local_f4 < local_f2) {
    uVar8 = local_f2;
  }
  std::__cxx11::to_string(&local_90,(uint)uVar8);
  std::operator+(&local_70,"Out of bounds, tried to add an edge involving vertex ",&local_90);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar9) {
    local_f0.field_2._M_allocated_capacity = *psVar9;
    local_f0.field_2._8_8_ = plVar7[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar9;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::to_string(&local_b0,(uint)this->number_of_vertices);
  std::operator+(&local_50,&local_f0,&local_b0);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = (long *)*plVar7;
  plVar10 = plVar7 + 2;
  if (local_d0 == plVar10) {
    local_c0 = *plVar10;
    lStack_b8 = plVar7[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar10;
  }
  local_c8 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool add_edge(vertex_index_t v, vertex_index_t w) {
		if (!directed && v > w) return add_edge(w, v);

		if (v >= number_of_vertices || w >= number_of_vertices)
			throw std::logic_error("Out of bounds, tried to add an edge involving vertex " +
			                       std::to_string(std::max(v, w)) + ", but there are only " +
			                       std::to_string(number_of_vertices) + " vertices.");

		const size_t vv = v >> 6;
		const size_t ww = w >> 6;

		// Prevent multiple insertions
		if (incidence_outgoing[v * incidence_row_length + ww] & (ONE_ << ((w - (ww << 6))))) return false;

		outdegrees[v]++;
		indegrees[w]++;
		edges.push_back(v);
		edges.push_back(w);

		incidence_outgoing[v * incidence_row_length + ww] |= ONE_ << ((w - (ww << 6)));

		incidence_incoming[w * incidence_row_length + vv] |= ONE_ << (v - (vv << 6));
		return true;
	}